

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# catch.hpp
# Opt level: O0

void __thiscall
Catch::AssertionStats::AssertionStats
          (AssertionStats *this,AssertionResult *_assertionResult,
          vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *_infoMessages,
          Totals *_totals)

{
  bool bVar1;
  void *in_RCX;
  long in_RSI;
  MessageBuilder *in_RDI;
  MessageBuilder builder;
  AssertionResult *in_stack_fffffffffffffed8;
  AssertionResult *in_stack_fffffffffffffee0;
  MessageBuilder *this_00;
  undefined8 in_stack_fffffffffffffee8;
  OfType type;
  value_type *__x;
  AssertionResult *this_01;
  StringRef *macroName;
  vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *in_stack_ffffffffffffff28;
  vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *in_stack_ffffffffffffff30;
  value_type local_78;
  void *local_20;
  long local_10;
  
  type = (OfType)((ulong)in_stack_fffffffffffffee8 >> 0x20);
  (in_RDI->super_MessageStream).m_stream.super_NonCopyable._vptr_NonCopyable =
       (_func_int **)&PTR__AssertionStats_002f0f20;
  macroName = (StringRef *)&(in_RDI->super_MessageStream).m_stream.m_index;
  local_20 = in_RCX;
  local_10 = in_RSI;
  AssertionResult::AssertionResult(in_stack_fffffffffffffee0,in_stack_fffffffffffffed8);
  clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::vector
            (in_stack_ffffffffffffff30,in_stack_ffffffffffffff28);
  memcpy(&in_RDI[1].m_info.lineInfo.line,local_20,0x38);
  in_RDI[1].m_info.macroName.m_size = *(size_type *)(local_10 + 0x78);
  bVar1 = AssertionResult::hasMessage((AssertionResult *)0x12a7b3);
  if (bVar1) {
    this_01 = (AssertionResult *)&(in_RDI->super_MessageStream).m_stream.m_index;
    AssertionResult::getTestMacroName(this_01);
    AssertionResult::getSourceInfo(this_01);
    AssertionResult::getResultType(this_01);
    MessageBuilder::MessageBuilder(in_RDI,macroName,(SourceLineInfo *)this_01,type);
    AssertionResult::getMessage_abi_cxx11_(in_stack_fffffffffffffed8);
    MessageBuilder::operator<<
              ((MessageBuilder *)in_stack_fffffffffffffee0,
               (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
               in_stack_fffffffffffffed8);
    std::__cxx11::string::~string((string *)&stack0xffffffffffffff30);
    ReusableStringStream::str_abi_cxx11_((ReusableStringStream *)in_stack_fffffffffffffed8);
    __x = &local_78;
    this_00 = (MessageBuilder *)&stack0xffffffffffffff10;
    std::__cxx11::string::operator=((string *)&local_78.message,(string *)this_00);
    std::__cxx11::string::~string((string *)this_00);
    clara::std::vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_>::push_back
              ((vector<Catch::MessageInfo,_std::allocator<Catch::MessageInfo>_> *)this_01,__x);
    MessageBuilder::~MessageBuilder(this_00);
  }
  return;
}

Assistant:

AssertionStats::AssertionStats( AssertionResult const& _assertionResult,
                                     std::vector<MessageInfo> const& _infoMessages,
                                     Totals const& _totals )
    :   assertionResult( _assertionResult ),
        infoMessages( _infoMessages ),
        totals( _totals )
    {
        assertionResult.m_resultData.lazyExpression.m_transientExpression = _assertionResult.m_resultData.lazyExpression.m_transientExpression;

        if( assertionResult.hasMessage() ) {
            // Copy message into messages list.
            // !TBD This should have been done earlier, somewhere
            MessageBuilder builder( assertionResult.getTestMacroName(), assertionResult.getSourceInfo(), assertionResult.getResultType() );
            builder << assertionResult.getMessage();
            builder.m_info.message = builder.m_stream.str();

            infoMessages.push_back( builder.m_info );
        }
    }